

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_see.c
# Opt level: O0

int tool_seek_cb(void *userdata,curl_off_t offset,int whence)

{
  __off64_t _Var1;
  per_transfer *per;
  int whence_local;
  curl_off_t offset_local;
  void *userdata_local;
  
  _Var1 = lseek64(*(int *)((long)userdata + 0x80),offset,whence);
  if (_Var1 == -1) {
    userdata_local._4_4_ = 2;
  }
  else {
    userdata_local._4_4_ = 0;
  }
  return userdata_local._4_4_;
}

Assistant:

int tool_seek_cb(void *userdata, curl_off_t offset, int whence)
{
  struct per_transfer *per = userdata;

#if(SIZEOF_CURL_OFF_T > SIZEOF_OFF_T) && !defined(USE_WIN32_LARGE_FILES)

  /* The offset check following here is only interesting if curl_off_t is
     larger than off_t and we are not using the Win32 large file support
     macros that provide the support to do 64-bit seeks correctly */

  if(offset > OUR_MAX_SEEK_O) {
    /* Some precaution code to work around problems with different data sizes
       to allow seeking >32-bit even if off_t is 32-bit. Should be very rare
       and is really valid on weirdo-systems. */
    curl_off_t left = offset;

    if(whence != SEEK_SET)
      /* this code path does not support other types */
      return CURL_SEEKFUNC_FAIL;

    if(LSEEK_ERROR == lseek(per->infd, 0, SEEK_SET))
      /* could not rewind to beginning */
      return CURL_SEEKFUNC_FAIL;

    while(left) {
      long step = (left > OUR_MAX_SEEK_O) ? OUR_MAX_SEEK_L : (long)left;
      if(LSEEK_ERROR == lseek(per->infd, step, SEEK_CUR))
        /* could not seek forwards the desired amount */
        return CURL_SEEKFUNC_FAIL;
      left -= step;
    }
    return CURL_SEEKFUNC_OK;
  }
#endif

  if(LSEEK_ERROR == lseek(per->infd, offset, whence))
    /* could not rewind, the reason is in errno but errno is just not portable
       enough and we do not actually care that much why we failed. We will let
       libcurl know that it may try other means if it wants to. */
    return CURL_SEEKFUNC_CANTSEEK;

  return CURL_SEEKFUNC_OK;
}